

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

int helicsInputGetVectorSize(HelicsInput inp)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
    sVar1 = helics::Input::getVectorSize(*(Input **)((long)inp + 0x18));
    iVar2 = (int)sVar1;
  }
  return iVar2;
}

Assistant:

int helicsInputGetVectorSize(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return 0;
    }
    try {
        return static_cast<int>(inpObj->inputPtr->getVectorSize());
    }
    // LCOV_EXCL_START
    catch (...) {
        return 0;
    }
    // LCOV_EXCL_STOP
}